

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::add_extension(session_impl *this,ext_function_t *ext)

{
  undefined1 local_38 [16];
  shared_ptr<libtorrent::plugin> local_28;
  
  ::std::
  make_shared<libtorrent::aux::session_impl::session_plugin_wrapper,std::function<std::shared_ptr<libtorrent::torrent_plugin>(libtorrent::torrent_handle_const&,libtorrent::client_data_t)>&>
            ((function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_libtorrent::client_data_t)>
              *)local_38);
  local_28.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_38._0_8_;
  local_28.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_;
  local_38._0_8_ = (void *)0x0;
  local_38._8_8_ = 0;
  add_ses_extension(this,&local_28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  return;
}

Assistant:

void session_impl::add_extension(ext_function_t ext)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(ext);

		add_ses_extension(std::make_shared<session_plugin_wrapper>(ext));
	}